

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  iterator iVar1;
  char_type in_ESI;
  basic_format_specs<wchar_t> *in_RDI;
  arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler> *this_00;
  char_spec_handler local_28 [2];
  
  this_00 = *(arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
              **)((in_RDI->fill).data_ + 1);
  char_spec_handler::char_spec_handler
            (local_28,(arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
                       *)in_RDI,in_ESI);
  handle_char_specs<wchar_t,fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::char_spec_handler>
            (in_RDI,(char_spec_handler *)this_00);
  iVar1 = out(this_00);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(char_type value) {
    internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    return out();
  }